

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

int ZSTD_literalsContribution(BYTE *literals,U32 litLength,optState_t *optPtr,int optLevel)

{
  U32 UVar1;
  int iVar2;
  int contribution;
  int optLevel_local;
  optState_t *optPtr_local;
  U32 litLength_local;
  BYTE *literals_local;
  
  UVar1 = ZSTD_rawLiteralsCost(literals,litLength,optPtr,optLevel);
  iVar2 = ZSTD_litLengthContribution(litLength,optPtr,optLevel);
  return UVar1 + iVar2;
}

Assistant:

static int ZSTD_literalsContribution(const BYTE* const literals, U32 const litLength,
                                     const optState_t* const optPtr,
                                     int optLevel)
{
    int const contribution = ZSTD_rawLiteralsCost(literals, litLength, optPtr, optLevel)
                           + ZSTD_litLengthContribution(litLength, optPtr, optLevel);
    return contribution;
}